

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O2

int exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
              (long seed,long pdf_first,long pdf_last,int *chosen_index)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar5 = *(ulong *)(pdf_first + 8);
  uVar3 = *(ulong *)(pdf_last + 8);
  if (uVar5 < uVar3) {
    fVar6 = 0.0;
    for (; uVar5 != uVar3; uVar5 = uVar5 + 8) {
      fVar7 = *(float *)(uVar5 + 4);
      if (fVar7 < 0.0) {
        *(undefined4 *)(uVar5 + 4) = 0;
        uVar3 = *(ulong *)(pdf_last + 8);
        fVar7 = 0.0;
      }
      fVar6 = fVar6 + fVar7;
    }
    fVar7 = 0.0;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      *chosen_index = 0;
      *(undefined4 *)(*(long *)(pdf_first + 8) + 4) = 0x3f800000;
      return 0;
    }
    fVar9 = ((float)((uint)(seed * 0x66d5deece66d + 0x7fffffffU >> 0x19) & 0x7fffff | 0x3f800000) +
            -1.0) * fVar6;
    fVar8 = fVar6;
    if (fVar9 <= fVar6) {
      fVar8 = fVar9;
    }
    iVar4 = -1;
    bVar1 = false;
    for (uVar5 = *(ulong *)(pdf_first + 8); uVar5 != uVar3; uVar5 = uVar5 + 8) {
      iVar4 = iVar4 + 1;
      fVar9 = *(float *)(uVar5 + 4);
      fVar7 = fVar7 + fVar9;
      if ((!bVar1) && (fVar8 < fVar7)) {
        *chosen_index = iVar4;
        fVar9 = *(float *)(uVar5 + 4);
        bVar1 = true;
      }
      *(float *)(uVar5 + 4) = fVar9 / fVar6;
      uVar3 = *(ulong *)(pdf_last + 8);
    }
    iVar2 = 0;
    if (!bVar1) {
      *chosen_index = iVar4;
      return iVar2;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }